

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewwidget.cpp
# Opt level: O3

int __thiscall QPrintPreviewWidgetPrivate::init(QPrintPreviewWidgetPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *pQVar1;
  QGraphicsView *this_00;
  char *pcVar2;
  QGraphicsScene *this_01;
  QVBoxLayout *this_02;
  long in_FS_OFFSET;
  QBrush local_40 [8];
  QObject local_38 [8];
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)&this->field_0x8;
  this_00 = (QGraphicsView *)operator_new(0x28);
  QGraphicsView::QGraphicsView(this_00,(QWidget *)0x0);
  *(undefined ***)this_00 = &PTR_metaObject_00166380;
  *(undefined ***)(this_00 + 0x10) = &PTR__GraphicsView_00166570;
  this->graphicsView = (GraphicsView *)this_00;
  QGraphicsView::setInteractive(SUB81(this_00,0));
  QGraphicsView::setDragMode((DragMode)this->graphicsView);
  QGraphicsView::setViewportUpdateMode((ViewportUpdateMode)this->graphicsView);
  pcVar2 = (char *)QAbstractScrollArea::verticalScrollBar();
  QObject::connect(local_30,pcVar2,(QObject *)"2valueChanged(int)",(char *)pQVar1,0x14e453);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  QObject::connect(local_38,(char *)this->graphicsView,(QObject *)"2resized()",(char *)pQVar1,
                   0x14e476);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  this_01 = (QGraphicsScene *)operator_new(0x10);
  QGraphicsScene::QGraphicsScene(this_01,(QObject *)this->graphicsView);
  this->scene = this_01;
  QBrush::QBrush(local_40,gray,SolidPattern);
  QGraphicsScene::setBackgroundBrush((QBrush *)this_01);
  QBrush::~QBrush(local_40);
  QGraphicsView::setScene((QGraphicsScene *)this->graphicsView);
  this_02 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_02,pQVar1);
  QLayout::setContentsMargins((int)this_02,0,0,0);
  QBoxLayout::addWidget(this_02,this->graphicsView,0,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewWidgetPrivate::init()
{
    Q_Q(QPrintPreviewWidget);

    graphicsView = new GraphicsView;
    graphicsView->setInteractive(false);
    graphicsView->setDragMode(QGraphicsView::ScrollHandDrag);
    graphicsView->setViewportUpdateMode(QGraphicsView::SmartViewportUpdate);
    QObject::connect(graphicsView->verticalScrollBar(), SIGNAL(valueChanged(int)),
                     q, SLOT(_q_updateCurrentPage()));
    QObject::connect(graphicsView, SIGNAL(resized()), q, SLOT(_q_fit()));

    scene = new QGraphicsScene(graphicsView);
    scene->setBackgroundBrush(Qt::gray);
    graphicsView->setScene(scene);

    QVBoxLayout *layout = new QVBoxLayout(q);
    layout->setContentsMargins(0, 0, 0, 0);
    layout->addWidget(graphicsView);
}